

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

int archive_write_client_free(archive_write_filter *f)

{
  archive *paVar1;
  long lVar2;
  void *__s;
  size_t __n;
  archive_write *a;
  archive_write_filter *f_local;
  
  paVar1 = f->archive;
  if (paVar1[1].error_string.buffer_length != 0) {
    (*(code *)paVar1[1].error_string.buffer_length)(paVar1);
  }
  paVar1[1].current_code = (char *)0x0;
  lVar2._0_4_ = paVar1[2].file_count;
  lVar2._4_4_ = paVar1[2].archive_error_number;
  if (lVar2 != 0) {
    __s = *(void **)&paVar1[2].file_count;
    __n = strlen(*(char **)&paVar1[2].file_count);
    memset(__s,0,__n);
    free(*(void **)&paVar1[2].file_count);
    paVar1[2].file_count = 0;
    paVar1[2].archive_error_number = 0;
  }
  return 0;
}

Assistant:

static int
archive_write_client_free(struct archive_write_filter *f)
{
	struct archive_write *a = (struct archive_write *)f->archive;

	if (a->client_freer)
		(*a->client_freer)(&a->archive, a->client_data);
	a->client_data = NULL;

	/* Clear passphrase. */
	if (a->passphrase != NULL) {
		memset(a->passphrase, 0, strlen(a->passphrase));
		free(a->passphrase);
		a->passphrase = NULL;
	}

	return (ARCHIVE_OK);
}